

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O1

void __thiscall TPZPostProcAnalysis::TransferSolution(TPZPostProcAnalysis *this)

{
  TPZCompMesh *pTVar1;
  TPZCompMesh *pTVar2;
  long lVar3;
  long lVar4;
  TPZBaseMatrix *pTVar5;
  int64_t iVar6;
  TPZFMatrix<double> *pTVar7;
  TPZFMatrix<double> *pTVar8;
  TPZCompEl **ppTVar9;
  TPZGeoEl *pTVar10;
  long lVar11;
  int64_t el;
  long nelem;
  double extraout_XMM0_Qa;
  
  TPZLinearAnalysis::AssembleResidual(&this->super_TPZLinearAnalysis);
  TPZSolutionMatrix::operator=
            (&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution,
             &(this->super_TPZLinearAnalysis).fRhs);
  TPZAnalysis::LoadSolution((TPZAnalysis *)this);
  pTVar1 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh;
  if (pTVar1 == (TPZCompMesh *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzpostprocanalysis.cpp"
               ,0x143);
  }
  pTVar2 = this->fpMainMesh;
  TPZGeoMesh::ResetReference(pTVar2->fReference);
  TPZCompMesh::LoadReferences(this->fpMainMesh);
  pTVar7 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar1->fElementSolution);
  pTVar8 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar2->fElementSolution);
  lVar3 = ((pTVar2->fElementSolution).fBaseMatrix)->fCol;
  lVar4 = (pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  pTVar5 = (pTVar1->fElementSolution).fBaseMatrix;
  if (pTVar5 != (TPZBaseMatrix *)0x0) {
    (*(pTVar5->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar5,lVar4,lVar3);
  }
  if (0 < lVar4 && lVar3 != 0) {
    nelem = 0;
    do {
      ppTVar9 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar10 = TPZCompEl::Reference(*ppTVar9);
      if (pTVar10 == (TPZGeoEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzpostprocanalysis.cpp"
                   ,0x158);
      }
      if (pTVar10->fReference == (TPZCompEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzpostprocanalysis.cpp"
                   ,0x15b);
      }
      if (0 < lVar3) {
        iVar6 = pTVar10->fReference->fIndex;
        lVar11 = 0;
        do {
          (*(pTVar8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x21])(pTVar8,iVar6,lVar11);
          if (((pTVar7->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= nelem) ||
             ((pTVar7->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pTVar7->fElem[(pTVar7->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar11 + nelem]
               = extraout_XMM0_Qa;
          lVar11 = lVar11 + 1;
        } while (lVar3 != lVar11);
      }
      nelem = nelem + 1;
    } while (nelem != lVar4);
  }
  return;
}

Assistant:

void TPZPostProcAnalysis::TransferSolution()
{

    // this is where we compute the projection of the post processed variables
    TPZLinearAnalysis::AssembleResidual();
    fSolution = Rhs();
    TPZLinearAnalysis::LoadSolution();
    
    TPZCompMesh *compmeshPostProcess = (Mesh());
    if (!compmeshPostProcess) {
        DebugStop();
    }
    // fpMainMesh is the mesh with the actual finite element approximation, but probably stored at
    // integration points
    TPZCompMesh *solmesh = fpMainMesh;
    fpMainMesh->Reference()->ResetReference();
    fpMainMesh->LoadReferences();
    //In case the post processing computed element solutions
    // copy the values from the post processing mesh to the finite element mesh
    TPZFMatrix<STATE> &comprefElSol = compmeshPostProcess->ElementSolution();
    // solmesh if the finite element simulation mesh
    const TPZFMatrix<STATE> &solmeshElSol = solmesh->ElementSolution();
    int64_t numelsol = solmesh->ElementSolution().Cols();
    int64_t nelem = compmeshPostProcess->NElements();
    compmeshPostProcess->ElementSolution().Redim(nelem, numelsol);
    if (numelsol) 
    {
        for (int64_t el=0; el<nelem; el++) {
            TPZCompEl *celpost = compmeshPostProcess->Element(el);
            TPZGeoEl *gel = celpost->Reference();
            // we dont acount for condensed elements submeshes etc
            if(!gel) DebugStop();
            TPZCompEl *cel = gel->Reference();
            if (!cel) {
                DebugStop();
            }
            int64_t index = cel->Index();
            // we copy from the simulation mesh to the post processing mesh
            for (int64_t isol=0; isol<numelsol; isol++) {
                comprefElSol(el,isol) = solmeshElSol.Get(index,isol);
            }
        }
    }
}